

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

void __thiscall wasm::I64ToI32Lowering::visitLocalGet(I64ToI32Lowering *this,LocalGet *curr)

{
  bool bVar1;
  Index index;
  Index index_00;
  mapped_type *pmVar2;
  pointer pBVar3;
  pointer this_00;
  LocalGet *value;
  Block *expression;
  Block *result;
  Type local_60;
  LocalSet *local_58;
  LocalSet *setHighBits;
  undefined1 local_48 [8];
  TempVar highBits;
  BasicType local_20;
  mapped_type local_1c;
  LocalGet *pLStack_18;
  mapped_type mappedIndex;
  LocalGet *curr_local;
  I64ToI32Lowering *this_local;
  
  pLStack_18 = curr;
  curr_local = (LocalGet *)this;
  pmVar2 = std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&this->indexMap,&curr->index);
  local_1c = *pmVar2;
  pLStack_18->index = local_1c;
  local_20 = i64;
  bVar1 = wasm::Type::operator!=
                    (&(pLStack_18->super_SpecificExpression<(wasm::Expression::Id)8>).
                      super_Expression.type,&local_20);
  if (!bVar1) {
    wasm::Type::Type(&highBits.ty,i32);
    (pLStack_18->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
         highBits.ty.id;
    wasm::Type::Type((Type *)&setHighBits,i32);
    getTemp((TempVar *)local_48,this,(Type)setHighBits);
    pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                       (&this->builder);
    index = TempVar::operator_cast_to_unsigned_int((TempVar *)local_48);
    this_00 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                        (&this->builder);
    index_00 = local_1c + 1;
    wasm::Type::Type(&local_60,i32);
    value = Builder::makeLocalGet(this_00,index_00,local_60);
    local_58 = Builder::makeLocalSet(pBVar3,index,(Expression *)value);
    pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                       (&this->builder);
    expression = Builder::blockify(pBVar3,(Expression *)local_58,(Expression *)pLStack_18);
    Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                ).
                super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
               (Expression *)expression);
    setOutParam(this,(Expression *)expression,(TempVar *)local_48);
    TempVar::~TempVar((TempVar *)local_48);
  }
  return;
}

Assistant:

void visitLocalGet(LocalGet* curr) {
    const auto mappedIndex = indexMap[curr->index];
    // Need to remap the local into the new naming scheme, regardless of
    // the type of the local.
    curr->index = mappedIndex;
    if (curr->type != Type::i64) {
      return;
    }
    curr->type = Type::i32;
    TempVar highBits = getTemp();
    LocalSet* setHighBits = builder->makeLocalSet(
      highBits, builder->makeLocalGet(mappedIndex + 1, Type::i32));
    Block* result = builder->blockify(setHighBits, curr);
    replaceCurrent(result);
    setOutParam(result, std::move(highBits));
  }